

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_wc.cpp
# Opt level: O1

bool __thiscall CmdWc::Execute(CmdWc *this)

{
  StrList *pSVar1;
  _List_node_base *p_Var2;
  string *p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  FileType FVar8;
  long *plVar9;
  ostream *poVar10;
  size_type *psVar11;
  long lVar12;
  bool bVar13;
  char *pcVar14;
  _List_node_base *p_Var15;
  ifstream fin;
  int local_28c;
  int local_288;
  int local_284;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  CmdWc *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [3];
  ostream local_1c0 [400];
  
  if ((this->super_Command).parameter.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size == 0) {
    pcVar14 = "error";
    lVar12 = 5;
    poVar10 = (ostream *)&std::cout;
LAB_0010b06c:
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar14,lVar12);
    bVar13 = false;
  }
  else {
    local_260 = this;
    if ((this->super_Command).option.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size == 0) {
      bVar4 = true;
      bVar13 = true;
      bVar5 = true;
    }
    else {
      pSVar1 = &(this->super_Command).option;
      p_Var15 = (pSVar1->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var15 == (_List_node_base *)pSVar1) {
        bVar4 = false;
        bVar13 = false;
        bVar5 = false;
      }
      else {
        bVar5 = false;
        bVar13 = false;
        bVar4 = false;
        do {
          p_Var2 = p_Var15 + 1;
          iVar7 = std::__cxx11::string::compare((char *)p_Var2);
          if (iVar7 == 0) {
            bVar5 = true;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)p_Var2);
            if (iVar7 == 0) {
              bVar4 = true;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)p_Var2);
              bVar13 = true;
              if (iVar7 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"wc: invalid option -- \'",0x17);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)p_Var15[1]._M_next,
                                     (long)p_Var15[1]._M_prev);
                pcVar14 = "\'";
                lVar12 = 1;
                goto LAB_0010b06c;
              }
            }
          }
          p_Var15 = p_Var15->_M_next;
        } while (p_Var15 != (_List_node_base *)pSVar1);
      }
    }
    pSVar1 = &(local_260->super_Command).parameter;
    p_Var15 = (pSVar1->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var15 == (_List_node_base *)pSVar1) {
      local_28c = 0;
      local_288 = 0;
      local_284 = 0;
    }
    else {
      paVar3 = &local_238[0].field_2;
      local_284 = 0;
      local_288 = 0;
      local_28c = 0;
      do {
        p = (string *)(p_Var15 + 1);
        FVar8 = DirUtils::GetFileType(p);
        if (FVar8 == DU_DIRECTORY) {
          std::operator+(&local_280,"wc: ",p);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_280);
          psVar11 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_238[0].field_2._0_8_ = *psVar11;
            local_238[0].field_2._8_8_ = plVar9[3];
            local_238[0]._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_238[0].field_2._0_8_ = *psVar11;
            local_238[0]._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_238[0]._M_string_length = plVar9[1];
          *plVar9 = (long)psVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                               local_238[0]._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._M_dataplus._M_p != paVar3) {
            operator_delete(local_238[0]._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p);
          }
          std::operator+(local_238,"0 0 0 ",p);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                               local_238[0]._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._M_dataplus._M_p != paVar3) {
            operator_delete(local_238[0]._M_dataplus._M_p);
          }
        }
        else {
          std::ifstream::ifstream(local_238,(p->_M_dataplus)._M_p,_S_bin);
          poVar10 = local_1c0;
          cVar6 = std::__basic_file<char>::is_open();
          if (cVar6 == '\0') {
            std::operator+(&local_258,"wc: ",p);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_258);
            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
            psVar11 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_280.field_2._M_allocated_capacity = *psVar11;
              local_280.field_2._8_8_ = plVar9[3];
            }
            else {
              local_280.field_2._M_allocated_capacity = *psVar11;
              local_280._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_280._M_string_length = plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_280._M_dataplus._M_p,
                                 local_280._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p);
            }
          }
          else {
            if (bVar13) {
              iVar7 = CntLine((CmdWc *)poVar10,p);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
              local_280._M_dataplus._M_p._0_1_ = 0x20;
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_280,1);
              local_284 = local_284 + iVar7;
            }
            if (bVar4) {
              iVar7 = CntWord((CmdWc *)poVar10,p);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
              local_280._M_dataplus._M_p._0_1_ = 0x20;
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_280,1);
              local_288 = local_288 + iVar7;
            }
            if (bVar5) {
              iVar7 = CntByte((CmdWc *)poVar10,p);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
              local_280._M_dataplus._M_p._0_1_ = 0x20;
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_280,1);
              local_28c = local_28c + iVar7;
            }
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)p_Var15[1]._M_next,
                                 (long)p_Var15[1]._M_prev);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
          }
          std::ifstream::~ifstream(local_238);
        }
        p_Var15 = p_Var15->_M_next;
      } while (p_Var15 != (_List_node_base *)pSVar1);
    }
    if ((local_260->super_Command).parameter.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size < 2) {
      return true;
    }
    if (bVar13) {
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_284);
      local_238[0]._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_238,1);
    }
    if (bVar4) {
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_288);
      local_238[0]._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_238,1);
    }
    if (bVar5) {
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_28c);
      local_238[0]._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_238,1);
    }
    poVar10 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"total",5);
    bVar13 = true;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  return bVar13;
}

Assistant:

bool CmdWc::Execute(){
	if(parameter.size() == 0){
		cout << "error" << endl;
		return false;
	}
	bool byteActive = false, wordActive = false, lineActive = false;
	if(option.size() == 0){
		byteActive = wordActive = lineActive = true;
	}
	else{
		for(auto i = option.begin(); i != option.end(); i++){
			if((*i) == "-c")byteActive = true;
			else if((*i) == "-w")wordActive = true;
			else if((*i) == "-l")lineActive = true;
			else{
				cout << "wc: invalid option -- '" << (*i) << "'" << endl;	
				return false;
			}
		}
	}
	
	int byteTotal = 0, wordTotal = 0, lineTotal = 0;
	for(auto i = parameter.begin(); i != parameter.end(); i++){
		int t;
		if(GetFileType(*i) == DU_DIRECTORY){
			cout << "wc: " + (*i) + ": Is a directory" << endl;
			cout << "0 0 0 " + (*i) << endl;
			continue;
		}
		ifstream fin((*i).c_str(), ios::binary);
		if(!fin.is_open()){
			cout << "wc: " + (*i) + ": No such file or directory" << endl;
			continue;
		}
		else{
			if(lineActive){
				t = CntLine(*i);
				lineTotal += t;
				cout << t << ' ';
			}
			if(wordActive){
				t = CntWord(*i);
				wordTotal += t;
				cout << t << ' ';
			}
			if(byteActive){
				t = CntByte(*i);
				byteTotal += t;
				cout << t << ' ';
			}
			cout << (*i) << endl;
		}
	}

	if(parameter.size() > 1){
		if(lineActive)cout << lineTotal << ' ';
		if(wordActive)cout << wordTotal << ' ';
		if(byteActive)cout << byteTotal << ' ';
		cout << "total" << endl;
	}
	return true;
}